

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O0

string * __thiscall
vkt::image::(anonymous_namespace)::getCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Texture *texture,
          deUint32 flags)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  ImageType local_1ac;
  int local_1a8;
  int i;
  int numComponents;
  ostringstream local_198 [8];
  ostringstream str;
  deUint32 flags_local;
  Texture *texture_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  pcVar3 = "";
  if (((ulong)texture & 1) != 0) {
    pcVar3 = "readonly_";
  }
  poVar1 = std::operator<<((ostream *)local_198,pcVar3);
  pcVar3 = "";
  if (((ulong)texture & 2) != 0) {
    pcVar3 = "writeonly_";
  }
  std::operator<<(poVar1,pcVar3);
  local_1a8 = Texture::dimension((Texture *)this);
  for (local_1ac = IMAGE_TYPE_1D; (int)local_1ac < local_1a8;
      local_1ac = local_1ac + IMAGE_TYPE_1D_ARRAY) {
    pcVar3 = "x";
    if (local_1ac == IMAGE_TYPE_1D) {
      pcVar3 = "";
    }
    poVar1 = std::operator<<((ostream *)local_198,pcVar3);
    Texture::size((Texture *)&stack0xfffffffffffffe48);
    piVar2 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)&stack0xfffffffffffffe48,local_1ac);
    std::ostream::operator<<(poVar1,*piVar2);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string getCaseName (const Texture& texture, const deUint32 flags)
{
	std::ostringstream str;
	str << ((flags & SizeTest::FLAG_READONLY_IMAGE) != 0 ? "readonly_" : "")
		<< ((flags & SizeTest::FLAG_WRITEONLY_IMAGE) != 0 ? "writeonly_" : "");

	const int numComponents = texture.dimension();
	for (int i = 0; i < numComponents; ++i)
		str << (i == 0 ? "" : "x") << texture.size()[i];

	return str.str();
}